

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_status_t flat_file_delete(ion_flat_file_t *flat_file,ion_key_t key)

{
  ulong location;
  uint7 uVar1;
  int iVar2;
  ion_err_t iVar3;
  ion_flat_file_row_t local_90;
  ion_err_t local_71;
  ulong uStack_70;
  ion_err_t row_err;
  ion_fpos_t last_record_index;
  ion_flat_file_row_t last_row;
  ion_fpos_t last_record_offset;
  ion_fpos_t loc;
  undefined1 local_38 [7];
  ion_err_t err;
  ion_flat_file_row_t row;
  ion_key_t key_local;
  ion_flat_file_t *flat_file_local;
  ion_status_t status;
  
  if (flat_file->sorted_mode == '\0') {
    flat_file_local = (ion_flat_file_t *)0x0;
    last_record_offset = -1;
    row.value = key;
    while( true ) {
      loc._7_1_ = flat_file_scan(flat_file,last_record_offset,&last_record_offset,
                                 (ion_flat_file_row_t *)local_38,'\x01',
                                 flat_file_predicate_key_match,row.value);
      uVar1 = flat_file_local._1_7_;
      iVar2 = flat_file_local._4_4_;
      if (loc._7_1_ != '\0') break;
      last_row.value = (ion_value_t)(flat_file->eof_position - flat_file->row_size);
      uStack_70 = (ulong)((long)last_row.value - flat_file->start_of_data) / flat_file->row_size;
      if (uStack_70 != last_record_offset) {
        local_71 = flat_file_read_row(flat_file,uStack_70,(ion_flat_file_row_t *)&last_record_index)
        ;
        if (local_71 != '\0') {
          flat_file_local = (ion_flat_file_t *)CONCAT71(uVar1,local_71);
          return (ion_status_t)flat_file_local;
        }
        iVar3 = flat_file_write_row(flat_file,last_record_offset,
                                    (ion_flat_file_row_t *)&last_record_index);
        if (iVar3 != '\0') {
          flat_file_local = (ion_flat_file_t *)CONCAT71(uVar1,iVar3);
          return (ion_status_t)flat_file_local;
        }
        local_71 = 0;
      }
      location = uStack_70;
      memset(&local_90,0,0x18);
      iVar3 = flat_file_write_row(flat_file,location,&local_90);
      if (iVar3 != '\0') {
        flat_file_local = (ion_flat_file_t *)CONCAT71(uVar1,iVar3);
        return (ion_status_t)flat_file_local;
      }
      flat_file->eof_position = (ion_fpos_t)last_row.value;
      flat_file_local = (ion_flat_file_t *)((ulong)(flat_file_local._4_4_ + 1) << 0x20);
      local_71 = 0;
    }
    flat_file_local = (ion_flat_file_t *)((ulong)uVar1 << 8);
    if (((loc._7_1_ == '\x0e') || (last_record_offset == -1)) && (iVar2 == 0)) {
      flat_file_local = (ion_flat_file_t *)CONCAT71(uVar1,1);
    }
    else if (loc._7_1_ != '\x0e') {
      flat_file_local = (ion_flat_file_t *)CONCAT71(uVar1,loc._7_1_);
    }
  }
  else {
    flat_file_local = (ion_flat_file_t *)CONCAT71(flat_file_local._1_7_,0x14);
    flat_file_local = (ion_flat_file_t *)((ulong)flat_file_local & 0xffffffff);
  }
  return (ion_status_t)flat_file_local;
}

Assistant:

ion_status_t
flat_file_delete(
	ion_flat_file_t *flat_file,
	ion_key_t		key
) {
	if (flat_file->sorted_mode) {
		return ION_STATUS_ERROR(err_sorted_order_violation);
	}

	ion_status_t		status	= ION_STATUS_INITIALIZE;
	ion_flat_file_row_t row;
	ion_err_t			err;
	ion_fpos_t			loc		= -1;

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_fpos_t			last_record_offset	= flat_file->eof_position - flat_file->row_size;
		ion_flat_file_row_t last_row;
		ion_fpos_t			last_record_index	= (last_record_offset - flat_file->start_of_data) / flat_file->row_size;
		ion_err_t			row_err;

		/* If the last index and the loc are the same, then we can just move the eof position. Saves a read/write. */
		if (last_record_index != loc) {
			row_err = flat_file_read_row(flat_file, last_record_index, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}

			row_err = flat_file_write_row(flat_file, loc, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}
		}

		/* Set last row to be empty just for sanity reasons. */
		row_err = flat_file_write_row(flat_file, last_record_index, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_EMPTY, NULL, NULL });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		/* Soft truncate the file by bumping the eof position back to cut off the last record. */
		flat_file->eof_position = last_record_offset;
		status.count++;

		/* No location movement is done here, since we need to check the row we just swapped in to see if it is
		   also a match. */
	}

	status.error = err_ok;

	if (((err == err_file_hit_eof) || (-1 == loc)) && (status.count == 0)) {
		status.error = err_item_not_found;
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}